

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

bool __thiscall cfd::core::AddressFormatData::IsValid(AddressFormatData *this)

{
  char *pcVar1;
  _Base_ptr p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  pointer ppcVar4;
  int iVar5;
  const_iterator cVar6;
  size_t sVar7;
  pointer ppcVar8;
  bool bVar9;
  initializer_list<const_char_*> __l;
  ByteData p2pkh;
  ByteData p2sh;
  undefined1 local_88 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_68;
  ByteData local_60;
  ByteData local_48;
  
  local_68 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this;
  if (IsValid()::key_list == '\0') {
    iVar5 = __cxa_guard_acquire(&IsValid()::key_list);
    if (iVar5 != 0) {
      local_88._16_8_ = (long)"Support addressType is p2pkh or p2sh" + 0x20;
      local_88._24_8_ = "bech32";
      local_88._0_8_ = "nettype";
      local_88._8_8_ = "p2pkh";
      __l._M_len = 4;
      __l._M_array = (iterator)local_88;
      ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&IsValid::key_list,__l,(allocator_type *)&local_60);
      __cxa_atexit(::std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector,
                   &IsValid::key_list,&__dso_handle);
      __cxa_guard_release(&IsValid()::key_list);
    }
  }
  ppcVar4 = IsValid::key_list.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (IsValid::key_list.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      IsValid::key_list.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pmVar3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_68->_M_impl;
    ppcVar8 = IsValid::key_list.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      ::std::__cxx11::string::string((string *)local_88,*ppcVar8,(allocator *)&local_60);
      cVar6 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_68,(key_type *)local_88);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      }
      if ((_Rb_tree_header *)cVar6._M_node == &(pmVar3->_M_t)._M_impl.super__Rb_tree_header)
      goto LAB_00472fce;
      ppcVar8 = ppcVar8 + 1;
    } while (ppcVar8 != ppcVar4);
  }
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"nettype","");
  cVar6 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(local_68,(key_type *)local_88);
  p_Var2 = cVar6._M_node[2]._M_parent;
  if ((char *)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  if (p_Var2 == (_Base_ptr)0x0) {
LAB_00472fce:
    bVar9 = false;
  }
  else {
    local_88._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"p2pkh","");
    cVar6 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(local_68,(key_type *)local_88);
    ByteData::ByteData(&local_60,(string *)(cVar6._M_node + 2));
    if ((char *)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
    }
    sVar7 = ByteData::GetDataSize(&local_60);
    if (sVar7 == 1) {
      local_88._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"p2sh","");
      cVar6 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_68,(key_type *)local_88);
      ByteData::ByteData(&local_48,(string *)(cVar6._M_node + 2));
      if ((char *)local_88._0_8_ != pcVar1) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      }
      sVar7 = ByteData::GetDataSize(&local_48);
      if (sVar7 == 1) {
        local_88._0_8_ = pcVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bech32","");
        cVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(local_68,(key_type *)local_88);
        if ((char *)local_88._0_8_ != pcVar1) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
        }
        bVar9 = (undefined1 *)((long)&cVar6._M_node[2]._M_parent[-1]._M_right + 7) <
                (undefined1 *)0x54;
      }
      else {
        bVar9 = false;
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar9 = false;
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar9;
}

Assistant:

bool AddressFormatData::IsValid() const {
  static const std::vector<const char*> key_list = {
      kNettype, kPrefixP2pkh, kPrefixP2sh, kPrefixBech32Hrp};
  for (const char* key : key_list) {
    if (map_.find(key) == map_.end()) return false;
  }
  try {
    if (map_.find(kNettype)->second.empty()) return false;

    auto p2pkh = ByteData(map_.find(kPrefixP2pkh)->second);
    if (p2pkh.GetDataSize() != 1) return false;
    auto p2sh = ByteData(map_.find(kPrefixP2sh)->second);
    if (p2sh.GetDataSize() != 1) return false;
    auto& bech32 = map_.find(kPrefixBech32Hrp)->second;
    if (bech32.empty() || (bech32.size() > 84)) return false;
  } catch (const CfdException&) {
    return false;
  }
  return true;
}